

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-flow-kill.c
# Opt level: O1

_Bool borg_flow_kill_aim(_Bool viewable)

{
  loc_conflict grid1;
  int iVar1;
  int iVar2;
  _Bool _Var3;
  wchar_t wVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  int iVar9;
  
  iVar2 = borg.c.y;
  iVar1 = borg.c.x;
  borg.c.x = iVar1;
  borg.c.y = iVar2;
  if (((((borg_kills_cnt != 0) && (borg.time_this_panel < 0x1f5)) && (borg.trait[0x6d] == 0)) &&
      ((borg.trait[0x6c] == 0 && (borg.trait[0x27] != 0)))) &&
     (_Var3 = borg_has_distance_attack(), !_Var3)) {
    iVar9 = -2;
    do {
      iVar5 = -2;
      do {
        if ((iVar5 != 0 || iVar9 != 0) &&
           (borg.c.y = iVar5 + iVar2,
           0xffffffc0 < (iVar5 + iVar2) - 0x41U && 0xffffff3c < (iVar1 + iVar9) - 0xc5U)) {
          borg.c.x = iVar1 + iVar9;
          if (borg_kills_nxt < 1) {
            iVar6 = 0;
          }
          else {
            lVar8 = 0xc;
            lVar7 = 0;
            do {
              grid1.y = borg.c.y;
              grid1.x = borg.c.x;
              wVar4 = distance(grid1,*(loc_conflict *)(borg_kills->spell + lVar8 + -0x19));
              if (wVar4 == L'\x01') break;
              lVar7 = lVar7 + 1;
              lVar8 = lVar8 + 0x1d8;
            } while (lVar7 < borg_kills_nxt);
            iVar6 = (int)lVar7;
          }
          if ((iVar6 == borg_kills_nxt) && (_Var3 = borg_has_distance_attack(), _Var3)) {
            borg_flow_clear();
            borg_flow_enqueue_grid(borg.c.y,borg.c.x);
            borg.c.x = iVar1;
            borg.c.y = iVar2;
            borg_flow_spread(L'\x05',true,!viewable,false,L'\xffffffff',false);
            _Var3 = borg_flow_commit("targetable position",L'\x01');
            if (!_Var3) {
              return false;
            }
            _Var3 = borg_flow_old(L'\x01');
            return _Var3;
          }
        }
        iVar5 = iVar5 + 1;
      } while (iVar5 != 3);
      iVar9 = iVar9 + 1;
      borg.c.x = iVar1;
      borg.c.y = iVar2;
    } while (iVar9 != 3);
  }
  return false;
}

Assistant:

bool borg_flow_kill_aim(bool viewable)
{
    int o_y, o_x;
    int s_c_y = borg.c.y;
    int s_c_x = borg.c.x;
    int i;

    /* Efficiency -- Nothing to kill */
    if (!borg_kills_cnt)
        return false;

    /* Sometimes we loop on this if we back  up to a point where */
    /* the monster is out of site */
    if (borg.time_this_panel > 500)
        return false;

    /* Not if Weak from hunger or no food */
    if (borg.trait[BI_ISHUNGRY] || borg.trait[BI_ISWEAK]
        || borg.trait[BI_FOOD] == 0)
        return false;

    /* If you can shoot from where you are, don't bother reaiming */
    if (borg_has_distance_attack())
        return false;

    /* Consider each adjacent spot */
    for (o_x = -2; o_x <= 2; o_x++) {
        for (o_y = -2; o_y <= 2; o_y++) {
            /* borg_attack would have already checked
               for a shot from where I currently am */
            if (o_x == 0 && o_y == 0)
                continue;

            /* XXX  Mess with where the program thinks the
               player is */
            borg.c.x = s_c_x + o_x;
            borg.c.y = s_c_y + o_y;

            /* avoid screen edges */
            if (borg.c.x > AUTO_MAX_X - 2 || borg.c.x < 2
                || borg.c.y > AUTO_MAX_Y - 2 || borg.c.y < 2)
                continue;

            /* Make sure we do not end up next to a monster */
            for (i = 0; i < borg_kills_nxt; i++) {
                if (distance(borg.c, borg_kills[i].pos) == 1)
                    break;
            }
            if (i != borg_kills_nxt)
                continue;

            /* Check for a distance attack from here */
            if (borg_has_distance_attack()) {
                /* Clear the flow codes */
                borg_flow_clear();

                /* Enqueue the grid */
                borg_flow_enqueue_grid(borg.c.y, borg.c.x);

                /* restore the saved player position */
                borg.c.x = s_c_x;
                borg.c.y = s_c_y;

                /* Spread the flow */
                borg_flow_spread(5, true, !viewable, false, -1, false);

                /* Attempt to Commit the flow */
                if (!borg_flow_commit("targetable position", GOAL_KILL))
                    return false;

                /* Take one step */
                if (!borg_flow_old(GOAL_KILL))
                    return false;

                return true;
            }
        }
    }

    /* restore the saved player position */
    borg.c.x = s_c_x;
    borg.c.y = s_c_y;

    return false;
}